

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirDEFARRAY(void)

{
  CStringsList *pCVar1;
  bool bVar2;
  int iVar3;
  CStringsList *local_30;
  CStringsList *local_20;
  CStringsList *a;
  char *id;
  bool plus;
  
  id._7_1_ = *lp == '+';
  if ((bool)id._7_1_) {
    lp = lp + 1;
  }
  bVar2 = White();
  if (bVar2) {
    local_30 = (CStringsList *)GetID(&lp);
  }
  else {
    local_30 = (CStringsList *)0x0;
  }
  a = local_30;
  if (local_30 == (CStringsList *)0x0) {
    Error("[DEFARRAY] Syntax error in <id>",lp,PASS3);
    SkipToEol(&lp);
  }
  else {
    bVar2 = White();
    if ((bVar2) && (iVar3 = SkipBlanks(), iVar3 == 0)) {
      if ((id._7_1_ & 1) == 0) {
        local_20 = (CStringsList *)0x0;
        bVar2 = dirDEFARRAY_parseItems(&local_20);
        pCVar1 = local_20;
        if ((bVar2) && (local_20 != (CStringsList *)0x0)) {
          CDefineTable::Add(&DefineTable,(char *)a,"",local_20);
        }
        else if ((local_20 != (CStringsList *)0x0) && (local_20 != (CStringsList *)0x0)) {
          CStringsList::~CStringsList(local_20);
          operator_delete(pCVar1,0x28);
        }
      }
      else {
        dirDEFARRAY_add((char *)a);
      }
    }
    else {
      iVar3 = SkipBlanks();
      if (iVar3 == 0) {
        Error("[DEFARRAY] missing space between <id> and first <item>",lp,PASS3);
      }
      else {
        Error("[DEFARRAY] must have at least one entry",(char *)0x0,PASS3);
      }
      SkipToEol(&lp);
    }
  }
  return;
}

Assistant:

static void dirDEFARRAY() {
	bool plus = ('+' == *lp) ? ++lp, true : false;
	const char* id = White() ? GetID(lp) : nullptr;
	if (!id) {
		Error("[DEFARRAY] Syntax error in <id>", lp);
		SkipToEol(lp);
		return;
	}
	if (!White() || SkipBlanks()) {	// enforce whitespace between ID and first item and detect empty ones
		if (SkipBlanks()) Error("[DEFARRAY] must have at least one entry");
		else Error("[DEFARRAY] missing space between <id> and first <item>", lp);
		SkipToEol(lp);
		return;
	}
	if (plus) {
		dirDEFARRAY_add(id);
	} else {
		CStringsList* a = NULL;
		if (!dirDEFARRAY_parseItems(&a) || NULL == a) {
			if (a) delete a;	// release already parsed items, if there was syntax error
			return;
		}
		DefineTable.Add(id, "", a);
	}
}